

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

INT W32toUnixAccessControl(DWORD flProtect)

{
  uint uVar1;
  INT IVar2;
  
  if ((char)flProtect == '\x01') {
    return 0;
  }
  uVar1 = flProtect & 0xff;
  if (uVar1 == 2) {
    IVar2 = 1;
  }
  else if (uVar1 == 0x40) {
    IVar2 = 7;
  }
  else if ((uVar1 == 0x10) || (uVar1 == 0x20)) {
    IVar2 = 5;
  }
  else {
    if (uVar1 != 4) {
      if (PAL_InitializeChakraCoreCalled) {
        return 0;
      }
      abort();
    }
    IVar2 = 3;
  }
  return IVar2;
}

Assistant:

INT W32toUnixAccessControl( IN DWORD flProtect )
{
    INT MemAccessControl = 0;

    switch ( flProtect & 0xff )
    {
    case PAGE_READONLY :
        MemAccessControl = PROT_READ;
        break;
    case PAGE_READWRITE :
        MemAccessControl = PROT_READ | PROT_WRITE;
        break;
    case PAGE_EXECUTE_READWRITE:
        MemAccessControl = PROT_EXEC | PROT_READ | PROT_WRITE;
        break;
    case PAGE_EXECUTE :
        MemAccessControl = PROT_EXEC | PROT_READ; // WinAPI PAGE_EXECUTE also implies readable
        break;
    case PAGE_EXECUTE_READ :
        MemAccessControl = PROT_EXEC | PROT_READ;
        break;
    case PAGE_NOACCESS :
        MemAccessControl = PROT_NONE;
        break;
    
    default:
        MemAccessControl = 0;
        ERROR( "Incorrect or no protection flags specified.\n" );
        break;
    }
    return MemAccessControl;
}